

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UEnumeration *
ucurr_getKeywordValuesForLocale_63(char *key,char *locale,UBool commonlyUsed,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UResType UVar3;
  int32_t iVar4;
  UResourceDataEntry *list;
  UList *list_00;
  UResourceBundle *resB;
  char *pcVar5;
  size_t sVar6;
  void *__dest;
  bool bVar7;
  char *tmpValue;
  char *value;
  UBool hasTo;
  char *pcStack_390;
  int32_t curIDLength;
  char *curID;
  char *pcStack_380;
  UBool isPrefRegion;
  char *region;
  UResourceBundle to;
  UResourceBundle curbndl;
  UResourceBundle regbndl;
  UResourceBundle bundlekey;
  UResourceBundle *bundle;
  UEnumeration *en;
  UList *otherValues;
  UList *values;
  UErrorCode *pUStack_30;
  char prefRegion [4];
  UErrorCode *status_local;
  UBool commonlyUsed_local;
  char *locale_local;
  char *key_local;
  
  pUStack_30 = status;
  ulocimp_getRegionForSupplementalData_63(locale,'\x01',(char *)((long)&values + 4),4,status);
  list = (UResourceDataEntry *)ulist_createEmptyList_63(pUStack_30);
  list_00 = ulist_createEmptyList_63(pUStack_30);
  bundle = (UResourceBundle *)uprv_malloc_63(0x38);
  UVar1 = U_FAILURE(*pUStack_30);
  if ((UVar1 == '\0') && (bundle != (UResourceBundle *)0x0)) {
    memcpy(bundle,&defaultKeywordValues,0x38);
    bundle->fData = list;
    resB = ures_openDirect_63("icudt63l-curr","supplementalData",pUStack_30);
    ures_getByKey_63(resB,"CurrencyMap",resB,pUStack_30);
    ures_initStackObject_63((UResourceBundle *)&regbndl.fSize);
    ures_initStackObject_63((UResourceBundle *)&curbndl.fSize);
    ures_initStackObject_63((UResourceBundle *)&to.fSize);
    ures_initStackObject_63((UResourceBundle *)&region);
LAB_0036fd44:
    UVar1 = U_SUCCESS(*pUStack_30);
    bVar7 = false;
    if (UVar1 != '\0') {
      UVar1 = ures_hasNext_63(resB);
      bVar7 = UVar1 != '\0';
    }
    if (bVar7) {
      ures_getNextResource_63(resB,(UResourceBundle *)&regbndl.fSize,pUStack_30);
      UVar1 = U_FAILURE(*pUStack_30);
      if (UVar1 != '\0') goto LAB_0037002c;
      pcStack_380 = ures_getKey_63((UResourceBundle *)&regbndl.fSize);
      iVar2 = strcmp(pcStack_380,(char *)((long)&values + 4));
      curID._7_1_ = iVar2 == 0;
      if (((bool)curID._7_1_) || (commonlyUsed == '\0')) {
        ures_getByKey_63(resB,pcStack_380,(UResourceBundle *)&curbndl.fSize,pUStack_30);
        UVar1 = U_FAILURE(*pUStack_30);
        if (UVar1 != '\0') goto LAB_0037002c;
LAB_0036fe26:
        do {
          UVar1 = U_SUCCESS(*pUStack_30);
          bVar7 = false;
          if (UVar1 != '\0') {
            UVar1 = ures_hasNext_63((UResourceBundle *)&curbndl.fSize);
            bVar7 = UVar1 != '\0';
          }
          if (!bVar7) goto LAB_0036fd44;
          ures_getNextResource_63
                    ((UResourceBundle *)&curbndl.fSize,(UResourceBundle *)&to.fSize,pUStack_30);
          UVar3 = ures_getType_63((UResourceBundle *)&to.fSize);
        } while (UVar3 != RES_TABLE);
        pcStack_390 = (char *)uprv_malloc_63(0x60);
        value._4_4_ = 0x60;
        if (pcStack_390 != (char *)0x0) {
          ures_getUTF8StringByKey_63
                    ((UResourceBundle *)&to.fSize,"id",pcStack_390,(int32_t *)((long)&value + 4),
                     '\x01',pUStack_30);
          UVar1 = U_FAILURE(*pUStack_30);
          if (UVar1 != '\0') goto LAB_0036fd44;
          value._3_1_ = '\0';
          ures_getByKey_63((UResourceBundle *)&to.fSize,"to",(UResourceBundle *)&region,pUStack_30);
          UVar1 = U_FAILURE(*pUStack_30);
          pcVar5 = pcStack_390;
          if (UVar1 == '\0') {
            value._3_1_ = '\x01';
          }
          else {
            *pUStack_30 = U_ZERO_ERROR;
          }
          if ((curID._7_1_ != '\0') && (value._3_1_ == '\0')) {
            sVar6 = strlen(pcStack_390);
            UVar1 = ulist_containsString_63((UList *)list,pcVar5,(int32_t)sVar6);
            if (UVar1 == '\0') {
              ulist_addItemEndList_63((UList *)list,pcStack_390,'\x01',pUStack_30);
              goto LAB_0036fe26;
            }
          }
          pcVar5 = pcStack_390;
          sVar6 = strlen(pcStack_390);
          UVar1 = ulist_containsString_63(list_00,pcVar5,(int32_t)sVar6);
          if ((UVar1 == '\0') && (commonlyUsed == '\0')) {
            ulist_addItemEndList_63(list_00,pcStack_390,'\x01',pUStack_30);
          }
          else {
            uprv_free_63(pcStack_390);
          }
          goto LAB_0036fe26;
        }
        *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
      }
      goto LAB_0036fd44;
    }
LAB_0037002c:
    UVar1 = U_SUCCESS(*pUStack_30);
    if (UVar1 == '\0') {
      ulist_deleteList_63((UList *)list);
      uprv_free_63(bundle);
      bundle = (UResourceBundle *)0x0;
    }
    else {
      if (commonlyUsed == '\0') {
        ulist_resetList_63(list_00);
        do {
          do {
            pcVar5 = (char *)ulist_getNext_63(list_00);
            if (pcVar5 == (char *)0x0) goto LAB_00370170;
            sVar6 = strlen(pcVar5);
            UVar1 = ulist_containsString_63((UList *)list,pcVar5,(int32_t)sVar6);
          } while (UVar1 != '\0');
          __dest = uprv_malloc_63(0x60);
          sVar6 = strlen(pcVar5);
          memcpy(__dest,pcVar5,sVar6 + 1);
          ulist_addItemEndList_63((UList *)list,__dest,'\x01',pUStack_30);
          UVar1 = U_FAILURE(*pUStack_30);
        } while (UVar1 == '\0');
      }
      else {
        iVar4 = ulist_getListSize_63((UList *)list);
        if (iVar4 == 0) {
          uenum_close_63((UEnumeration *)bundle);
          bundle = (UResourceBundle *)
                   ucurr_getKeywordValuesForLocale_63(key,"und",'\x01',pUStack_30);
        }
      }
LAB_00370170:
      ulist_resetList_63((UList *)bundle->fData);
    }
    ures_close_63((UResourceBundle *)&region);
    ures_close_63((UResourceBundle *)&to.fSize);
    ures_close_63((UResourceBundle *)&curbndl.fSize);
    ures_close_63((UResourceBundle *)&regbndl.fSize);
    ures_close_63(resB);
    ulist_deleteList_63(list_00);
    key_local = (char *)bundle;
  }
  else {
    if (bundle == (UResourceBundle *)0x0) {
      *pUStack_30 = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      uprv_free_63(bundle);
    }
    ulist_deleteList_63((UList *)list);
    ulist_deleteList_63(list_00);
    key_local = (char *)0x0;
  }
  return (UEnumeration *)key_local;
}

Assistant:

U_CAPI UEnumeration *U_EXPORT2 ucurr_getKeywordValuesForLocale(const char *key, const char *locale, UBool commonlyUsed, UErrorCode* status) {
    // Resolve region
    char prefRegion[ULOC_COUNTRY_CAPACITY];
    ulocimp_getRegionForSupplementalData(locale, TRUE, prefRegion, sizeof(prefRegion), status);
    
    // Read value from supplementalData
    UList *values = ulist_createEmptyList(status);
    UList *otherValues = ulist_createEmptyList(status);
    UEnumeration *en = (UEnumeration *)uprv_malloc(sizeof(UEnumeration));
    if (U_FAILURE(*status) || en == NULL) {
        if (en == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            uprv_free(en);
        }
        ulist_deleteList(values);
        ulist_deleteList(otherValues);
        return NULL;
    }
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    en->context = values;
    
    UResourceBundle *bundle = ures_openDirect(U_ICUDATA_CURR, "supplementalData", status);
    ures_getByKey(bundle, "CurrencyMap", bundle, status);
    UResourceBundle bundlekey, regbndl, curbndl, to;
    ures_initStackObject(&bundlekey);
    ures_initStackObject(&regbndl);
    ures_initStackObject(&curbndl);
    ures_initStackObject(&to);
    
    while (U_SUCCESS(*status) && ures_hasNext(bundle)) {
        ures_getNextResource(bundle, &bundlekey, status);
        if (U_FAILURE(*status)) {
            break;
        }
        const char *region = ures_getKey(&bundlekey);
        UBool isPrefRegion = uprv_strcmp(region, prefRegion) == 0 ? TRUE : FALSE;
        if (!isPrefRegion && commonlyUsed) {
            // With commonlyUsed=true, we do not put
            // currencies for other regions in the
            // result list.
            continue;
        }
        ures_getByKey(bundle, region, &regbndl, status);
        if (U_FAILURE(*status)) {
            break;
        }
        while (U_SUCCESS(*status) && ures_hasNext(&regbndl)) {
            ures_getNextResource(&regbndl, &curbndl, status);
            if (ures_getType(&curbndl) != URES_TABLE) {
                // Currently, an empty ARRAY is mixed in.
                continue;
            }
            char *curID = (char *)uprv_malloc(sizeof(char) * ULOC_KEYWORDS_CAPACITY);
            int32_t curIDLength = ULOC_KEYWORDS_CAPACITY;
            if (curID == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }

#if U_CHARSET_FAMILY==U_ASCII_FAMILY
            ures_getUTF8StringByKey(&curbndl, "id", curID, &curIDLength, TRUE, status);
            /* optimize - use the utf-8 string */
#else
            {
                       const UChar* defString = ures_getStringByKey(&curbndl, "id", &curIDLength, status);
                       if(U_SUCCESS(*status)) {
			   if(curIDLength+1 > ULOC_KEYWORDS_CAPACITY) {
				*status = U_BUFFER_OVERFLOW_ERROR;
			   } else {
                           	u_UCharsToChars(defString, curID, curIDLength+1);
			   }
                       }
            }
#endif	

            if (U_FAILURE(*status)) {
                break;
            }
            UBool hasTo = FALSE;
            ures_getByKey(&curbndl, "to", &to, status);
            if (U_FAILURE(*status)) {
                // Do nothing here...
                *status = U_ZERO_ERROR;
            } else {
                hasTo = TRUE;
            }
            if (isPrefRegion && !hasTo && !ulist_containsString(values, curID, (int32_t)uprv_strlen(curID))) {
                // Currently active currency for the target country
                ulist_addItemEndList(values, curID, TRUE, status);
            } else if (!ulist_containsString(otherValues, curID, (int32_t)uprv_strlen(curID)) && !commonlyUsed) {
                ulist_addItemEndList(otherValues, curID, TRUE, status);
            } else {
                uprv_free(curID);
            }
        }
        
    }
    if (U_SUCCESS(*status)) {
        if (commonlyUsed) {
            if (ulist_getListSize(values) == 0) {
                // This could happen if no valid region is supplied in the input
                // locale. In this case, we use the CLDR's default.
                uenum_close(en);
                en = ucurr_getKeywordValuesForLocale(key, "und", TRUE, status);
            }
        } else {
            // Consolidate the list
            char *value = NULL;
            ulist_resetList(otherValues);
            while ((value = (char *)ulist_getNext(otherValues)) != NULL) {
                if (!ulist_containsString(values, value, (int32_t)uprv_strlen(value))) {
                    char *tmpValue = (char *)uprv_malloc(sizeof(char) * ULOC_KEYWORDS_CAPACITY);
                    uprv_memcpy(tmpValue, value, uprv_strlen(value) + 1);
                    ulist_addItemEndList(values, tmpValue, TRUE, status);
                    if (U_FAILURE(*status)) {
                        break;
                    }
                }
            }
        }
        
        ulist_resetList((UList *)(en->context));
    } else {
        ulist_deleteList(values);
        uprv_free(en);
        values = NULL;
        en = NULL;
    }
    ures_close(&to);
    ures_close(&curbndl);
    ures_close(&regbndl);
    ures_close(&bundlekey);
    ures_close(bundle);
    
    ulist_deleteList(otherValues);
    
    return en;
}